

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDimple * __thiscall ON_SubD::SubDimple(ON_SubD *this,bool bCreateIfNeeded)

{
  ON_SubDimple *this_00;
  __shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  this_00 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 == (ON_SubDimple *)0x0 && bCreateIfNeeded) {
    this_00 = (ON_SubDimple *)operator_new(0x810);
    ON_SubDimple::ON_SubDimple(this_00);
    std::__shared_ptr<ON_SubDimple,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ON_SubDimple,void>
              ((__shared_ptr<ON_SubDimple,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,this_00);
    std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>,
               &_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  return this_00;
}

Assistant:

ON_SubDimple* ON_SubD::SubDimple(bool bCreateIfNeeded)
{
  ON_SubDimple* subdimple = m_subdimple_sp.get();
  if (nullptr == subdimple && bCreateIfNeeded)
  {
    subdimple = new ON_SubDimple();
    m_subdimple_sp = std::shared_ptr<ON_SubDimple>(subdimple);
  }
  return subdimple;
}